

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_EncodeBase64DataEmpty_Test::TestBody(CryptoUtil_EncodeBase64DataEmpty_Test *this)

{
  char *message;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  string result;
  ByteData data;
  
  cfd::core::ByteData::ByteData(&data);
  cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_((ByteData *)&result);
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"result.c_str()","\"\"",result._M_dataplus._M_p,"");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x23e,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  return;
}

Assistant:

TEST(CryptoUtil, EncodeBase64DataEmpty) {
  ByteData data;
  std::string result = CryptoUtil::EncodeBase64(data);
  EXPECT_STREQ(result.c_str(), "");
}